

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall
QGraphicsScenePrivate::drawItemHelper
          (QGraphicsScenePrivate *this,QGraphicsItem *item,QPainter *painter,
          QStyleOptionGraphicsItem *option,QWidget *widget,bool painterStateProtection)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  QGraphicsItemPrivate *this_00;
  QRegion QVar6;
  Key KVar7;
  bool bVar8;
  char cVar9;
  char cVar10;
  bool bVar11;
  byte bVar12;
  RenderHints RVar13;
  QGraphicsProxyWidget *this_01;
  QWidget *pQVar14;
  QGraphicsItemCache *lhs;
  ulong uVar15;
  undefined8 uVar16;
  DeviceData *pDVar17;
  QTransform *pQVar18;
  undefined1 *puVar19;
  double *pdVar20;
  QSize QVar21;
  QPoint QVar22;
  long lVar23;
  qreal *pqVar24;
  long lVar25;
  Representation RVar26;
  ulong uVar27;
  int iVar28;
  QRectF *rect_2;
  QRectF *pQVar29;
  Representation RVar30;
  QRect *r;
  undefined8 *puVar31;
  DeviceData *pDVar32;
  QRect *pQVar33;
  QPainter *pQVar34;
  QRectF *rect;
  uint uVar35;
  int iVar36;
  int iVar37;
  Representation RVar38;
  QRectF *rect_1;
  long in_FS_OFFSET;
  byte bVar39;
  qreal c;
  double dVar40;
  qreal qVar41;
  double dVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  QRect QVar46;
  undefined1 local_238 [8];
  double local_230;
  double local_228;
  double local_220;
  QRegion exposed;
  QRegion pixmapExposed_1;
  QRegion scrollExposure;
  bool invertable;
  undefined1 local_1d8 [12];
  Representation RStack_1cc;
  QRegion pixmapExposed;
  Representation RStack_1c0;
  Representation RStack_1bc;
  undefined1 local_1b8 [4];
  Representation RStack_1b4;
  Representation RStack_1b0;
  Representation RStack_1ac;
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  undefined1 *local_198;
  undefined1 *puStack_190;
  undefined1 *local_188;
  Key pixmapKey;
  QRectF local_178;
  Representation local_158;
  Representation RStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  QPainter newPixPainter;
  Representation RStack_134;
  QTransform local_e8;
  QTransform itemToPixmap;
  Key local_40;
  long local_38;
  
  bVar39 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (item->d_ptr).d;
  uVar35 = *(uint *)&this_00->field_0x160 >> 0x15 & 3;
  if (uVar35 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      _q_paintItem(item,painter,option,widget,true,painterStateProtection);
      return;
    }
    goto LAB_0059d454;
  }
  QPainter::device();
  c = (qreal)QPaintDevice::devicePixelRatio();
  dVar40 = (double)QPainter::opacity();
  bVar8 = QGraphicsItem::isWidget(item);
  dVar42 = dVar40;
  if (((bVar8) &&
      (this_01 = (QGraphicsProxyWidget *)
                 QtPrivate::qobject_cast_helper<QGraphicsProxyWidget*,QObject>
                           ((QObject *)(item + -1)), this_01 != (QGraphicsProxyWidget *)0x0)) &&
     (pQVar14 = QGraphicsProxyWidget::widget(this_01), pQVar14 != (QWidget *)0x0)) {
    pQVar14 = QGraphicsProxyWidget::widget(this_01);
    qVar41 = QWidget::windowOpacity(pQVar14);
    dVar42 = (double)(~-(ulong)(qVar41 < 1.0) & (ulong)dVar40 |
                     (ulong)(dVar40 * qVar41) & -(ulong)(qVar41 < 1.0));
  }
  local_148 = 0xffffffff;
  uStack_144 = 0xffffffff;
  uStack_140 = 0xffffffff;
  uStack_13c = 0xffffffff;
  local_158.m_i = -1;
  RStack_154.m_i = -1;
  uStack_150 = 0xffffffff;
  uStack_14c = 0xffffffff;
  (*item->_vptr_QGraphicsItem[3])(&local_158,item);
  local_178.xp = (qreal)CONCAT44(RStack_154.m_i,local_158.m_i);
  local_178.yp = (qreal)CONCAT44(uStack_14c,uStack_150);
  local_178.w = (qreal)CONCAT44(uStack_144,local_148);
  local_178.h = (qreal)CONCAT44(uStack_13c,uStack_140);
  _q_adjustRect(&local_178);
  if ((0.0 < local_178.w) && (0.0 < local_178.h)) {
    pixmapKey.d = (KeyData *)&DAT_aaaaaaaaaaaaaaaa;
    QPixmapCache::Key::Key(&pixmapKey);
    local_188 = &DAT_aaaaaaaaaaaaaaaa;
    local_198 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_190 = &DAT_aaaaaaaaaaaaaaaa;
    QPixmap::QPixmap((QPixmap *)&local_198);
    lhs = QGraphicsItemPrivate::extraItemCache(this_00);
    if (uVar35 == 1) {
      QPixmapCache::Key::operator=(&pixmapKey,&lhs->key);
    }
    else {
      local_e8.m_matrix[0][0] = (qreal)&widget->super_QPaintDevice;
      if (widget == (QWidget *)0x0) {
        local_e8.m_matrix[0][0]._0_4_ = 0;
        local_e8.m_matrix[0][0]._4_4_ = 0;
      }
      QHash<QPaintDevice_*,_QGraphicsItemCache::DeviceData>::value
                ((DeviceData *)&itemToPixmap,&lhs->deviceData,(QPaintDevice **)&local_e8);
      KVar7 = pixmapKey;
      pixmapKey.d = local_40.d;
      local_40.d = KVar7.d;
      QPixmapCache::Key::~Key(&local_40);
    }
    cVar9 = QPixmapCache::find(&pixmapKey,(QPixmap *)&local_198);
    if (uVar35 == 1) {
      uVar35 = (lhs->fixedSize).ht.m_i;
      uVar5 = (lhs->fixedSize).wd.m_i;
      auVar45 = QRectF::toAlignedRect();
      bVar8 = (int)(uVar5 | uVar35) < 0;
      if (bVar8) {
        local_238._0_4_ = (auVar45._8_4_ - auVar45._0_4_) + 1;
        local_238._4_4_ = (auVar45._12_4_ - auVar45._4_4_) + 1;
      }
      else {
        local_238 = *(undefined1 (*) [8])&lhs->fixedSize;
      }
      QSize::operator*=((QSize *)local_238,c);
      uVar35 = (lhs->fixedSize).ht.m_i | (lhs->fixedSize).wd.m_i;
      iVar28 = (int)uVar35 >> 0x1f;
      uVar16 = 0;
      if ((int)uVar35 < 0) {
        uVar16 = 0xc000000000000000;
      }
      auVar43._8_8_ = (double)(iVar28 * -2);
      auVar43._0_8_ = uVar16;
      auVar44._8_8_ = c;
      auVar44._0_8_ = c;
      auVar43 = divpd(auVar43,auVar44);
      iVar28 = iVar28 * -4;
      local_1b8 = (undefined1  [4])((int)auVar43._0_8_ + auVar45._0_4_);
      RStack_1b4.m_i = (int)auVar43._0_8_ + auVar45._4_4_;
      RStack_1b0.m_i = (int)auVar43._8_8_ + auVar45._8_4_;
      RStack_1ac.m_i = (int)auVar43._8_8_ + auVar45._12_4_;
      cVar10 = QPixmap::isNull();
      if (cVar10 == '\0') {
        if (bVar8) {
          iVar37 = local_238._0_4_ + iVar28;
          iVar36 = local_238._4_4_ + iVar28;
          uVar16 = QPixmap::size();
          if ((iVar37 != (int)uVar16) || (iVar36 != (int)((ulong)uVar16 >> 0x20)))
          goto LAB_0059c40f;
        }
        bVar11 = ::operator!=(&lhs->boundingRect,(QRect *)local_1b8);
        if (bVar11) goto LAB_0059c4b2;
        if (((lhs->allExposed & 1U) != 0) || ((lhs->exposed).d.size != 0)) goto LAB_0059c4d2;
      }
      else {
LAB_0059c40f:
        local_e8.m_matrix[0][0]._0_4_ = local_238._0_4_ + iVar28;
        local_e8.m_matrix[0][0]._4_4_ = iVar28 + local_238._4_4_;
        QPixmap::QPixmap((QPixmap *)&itemToPixmap,(QSize *)&local_e8);
        QPixmap::operator=((QPixmap *)&local_198,(QPixmap *)&itemToPixmap);
        QPixmap::~QPixmap((QPixmap *)&itemToPixmap);
LAB_0059c4b2:
        (lhs->boundingRect).x1 = (Representation)local_1b8;
        (lhs->boundingRect).y1 = (Representation)RStack_1b4.m_i;
        (lhs->boundingRect).x2 = (Representation)RStack_1b0.m_i;
        (lhs->boundingRect).y2 = (Representation)RStack_1ac.m_i;
        QList<QRectF>::clear(&lhs->exposed);
        lhs->allExposed = true;
LAB_0059c4d2:
        if (cVar9 != '\0') {
          QPixmapCache::remove(&pixmapKey);
        }
        pqVar24 = (qreal *)&DAT_006795c0;
        pQVar18 = &itemToPixmap;
        for (lVar25 = 10; lVar25 != 0; lVar25 = lVar25 + -1) {
          pQVar18->m_matrix[0][0] = *pqVar24;
          pqVar24 = pqVar24 + (ulong)bVar39 * -2 + 1;
          pQVar18 = (QTransform *)((long)pQVar18 + ((ulong)bVar39 * -2 + 1) * 8);
        }
        pqVar24 = (qreal *)&DAT_00679578;
        pQVar18 = &itemToPixmap;
        for (lVar25 = 9; lVar25 != 0; lVar25 = lVar25 + -1) {
          pQVar18->m_matrix[0][0] = *pqVar24;
          pqVar24 = pqVar24 + (ulong)bVar39 * -2 + 1;
          pQVar18 = (QTransform *)((long)pQVar18 + ((ulong)bVar39 * -2 + 1) * 8);
        }
        itemToPixmap._72_2_ = 0xa800;
        if (!bVar8) {
          QTransform::scale(((double)(int)local_238._0_4_ / c) /
                            (double)CONCAT44(uStack_144,local_148),
                            ((double)(int)local_238._4_4_ / c) /
                            (double)CONCAT44(uStack_13c,uStack_140));
        }
        QTransform::translate((double)-(int)local_1b8,(double)-RStack_1b4.m_i);
        QStyleOptionGraphicsItem::operator=(&this->styleOptionTmp,option);
        pixmapExposed.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
        QRegion::QRegion(&pixmapExposed);
        local_e8.m_matrix[0][2] = 0.0;
        local_e8.m_matrix[1][0] = 0.0;
        local_e8.m_matrix[0][0] = 0.0;
        local_e8.m_matrix[0][1] = 0.0;
        if (lhs->allExposed == false) {
          pQVar29 = (lhs->exposed).d.ptr;
          for (lVar25 = (lhs->exposed).d.size << 5; lVar25 != 0; lVar25 = lVar25 + -0x20) {
            QRectF::operator|=((QRectF *)&local_e8,pQVar29);
            QTransform::mapRect((QRectF *)&newPixPainter);
            exposed.d = (QRegionData *)QRectF::toAlignedRect();
            QRegion::operator+=(&pixmapExposed,(QRect *)&exposed);
            pQVar29 = pQVar29 + 1;
          }
        }
        else {
          local_e8.m_matrix[0][0]._4_4_ = RStack_154.m_i;
          local_e8.m_matrix[0][0]._0_4_ = local_158.m_i;
          local_e8.m_matrix[0][1] = (qreal)CONCAT44(uStack_14c,uStack_150);
          local_e8.m_matrix[0][2] = (qreal)CONCAT44(uStack_144,local_148);
          local_e8.m_matrix[1][0] = (qreal)CONCAT44(uStack_13c,uStack_140);
        }
        (this->styleOptionTmp).exposedRect.w = local_e8.m_matrix[0][2];
        (this->styleOptionTmp).exposedRect.h = local_e8.m_matrix[1][0];
        (this->styleOptionTmp).exposedRect.xp = local_e8.m_matrix[0][0];
        (this->styleOptionTmp).exposedRect.yp = local_e8.m_matrix[0][1];
        QPixmap::setDevicePixelRatio(c);
        RVar13.super_QFlagsStorageHelper<QPainter::RenderHint,_4>.
        super_QFlagsStorage<QPainter::RenderHint>.i =
             (QFlagsStorageHelper<QPainter::RenderHint,_4>)QPainter::renderHints();
        _q_paintIntoCache((QPixmap *)&local_198,item,&pixmapExposed,&itemToPixmap,RVar13,
                          &this->styleOptionTmp,painterStateProtection);
        QPixmapCache::insert((QPixmap *)&newPixPainter);
        QVar21 = (QSize)(lhs->key).d;
        (lhs->key).d = (KeyData *)_newPixPainter;
        _newPixPainter = QVar21;
        QPixmapCache::Key::~Key((Key *)&newPixPainter);
        lhs->allExposed = false;
        QList<QRectF>::clear(&lhs->exposed);
        QRegion::~QRegion(&pixmapExposed);
      }
      if ((dVar42 != dVar40) || (NAN(dVar42) || NAN(dVar40))) {
        QPainter::setOpacity(dVar42);
        itemToPixmap.m_matrix[0][0] = (qreal)CONCAT44(RStack_1b4.m_i,local_1b8);
        QPainter::drawPixmap(painter,(QPoint *)&itemToPixmap,(QPixmap *)&local_198);
        QPainter::setOpacity(dVar40);
      }
      else {
        itemToPixmap.m_matrix[0][0] = (qreal)CONCAT44(RStack_1b4.m_i,local_1b8);
        QPainter::drawPixmap(painter,(QPoint *)&itemToPixmap,(QPixmap *)&local_198);
      }
    }
    else if (uVar35 == 2) {
      local_1a8 = 0xffffffff;
      uStack_1a4 = 0xffffffff;
      uStack_1a0 = 0xffffffff;
      uStack_19c = 0xffffffff;
      local_1b8 = (undefined1  [4])0xffffffff;
      RStack_1b4.m_i = -1;
      RStack_1b0.m_i = -1;
      RStack_1ac.m_i = -1;
      QPainter::worldTransform();
      QTransform::mapRect((QRectF *)local_1b8);
      pixmapExposed.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      QVar46 = QRectF::toRect((QRectF *)local_1b8);
      uVar2 = QVar46._0_8_ + 0xffffffff;
      uVar1 = QVar46._8_8_ + 1;
      uVar15 = (QVar46._0_8_ & 0xffffffff00000000) - 0x100000000;
      pixmapExposed.d = (QRegionData *)(uVar2 & 0xffffffff | uVar15);
      uVar27 = QVar46._8_8_ | 0xffffffff;
      lVar25 = (uVar1 & 0xffffffff) + uVar27 + 1;
      if (((int)uVar2 <= (int)uVar1) && ((int)(uVar15 >> 0x20) <= (int)(uVar27 + 1 >> 0x20))) {
        stack0xfffffffffffffe30 = &DAT_aaaaaaaaaaaaaaaa;
        local_1d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        if (widget == (QWidget *)0x0) {
          _local_1d8 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
        }
        else {
          _local_1d8 = QWidget::rect(widget);
          cVar10 = QRect::intersects((QRect *)local_1d8);
          if (cVar10 == '\0') goto LAB_0059d415;
        }
        QGraphicsItemPrivate::extra((QVariant *)&itemToPixmap,this_00,ExtraMaxDeviceCoordCacheSize);
        uVar16 = ::QVariant::toSize();
        ::QVariant::~QVariant((QVariant *)&itemToPixmap);
        iVar28 = (int)((ulong)uVar16 >> 0x20);
        RStack_1c0.m_i = (int)lVar25;
        RStack_1bc.m_i = (int)((ulong)lVar25 >> 0x20);
        if ((iVar28 < 1 || (int)uVar16 < 1) ||
           (((RStack_1c0.m_i - (int)pixmapExposed.d) + 1 <= (int)uVar16 &&
            ((RStack_1bc.m_i - pixmapExposed.d._4_4_) + 1 <= iVar28)))) {
          itemToPixmap.m_matrix[0][0] = (qreal)&widget->super_QPaintDevice;
          if (widget == (QWidget *)0x0) {
            itemToPixmap.m_matrix[0][0] = 0.0;
          }
          pDVar17 = QHash<QPaintDevice_*,_QGraphicsItemCache::DeviceData>::operator[]
                              (&lhs->deviceData,(QPaintDevice **)&itemToPixmap);
          pqVar24 = (qreal *)&DAT_006795c0;
          pQVar18 = &itemToPixmap;
          for (lVar25 = 10; lVar25 != 0; lVar25 = lVar25 + -1) {
            pQVar18->m_matrix[0][0] = *pqVar24;
            pqVar24 = pqVar24 + (ulong)bVar39 * -2 + 1;
            pQVar18 = (QTransform *)((long)pQVar18 + ((ulong)bVar39 * -2 + 1) * 8);
          }
          QTransform::inverted((bool *)&itemToPixmap);
          pQVar18 = (QTransform *)QPainter::worldTransform();
          QTransform::operator*=(&itemToPixmap,pQVar18);
          puVar19 = (undefined1 *)QPainter::worldTransform();
          pDVar32 = pDVar17;
          for (lVar25 = 0x4a; lVar25 != 0; lVar25 = lVar25 + -1) {
            *(undefined1 *)(pDVar32->lastTransform).m_matrix[0] = *puVar19;
            puVar19 = puVar19 + (ulong)bVar39 * -2 + 1;
            pDVar32 = (DeviceData *)((long)pDVar32 + (ulong)bVar39 * -2 + 1);
          }
          iVar28 = QTransform::type();
          if (iVar28 < 2) {
            pdVar20 = (double *)QPainter::worldTransform();
            iVar28 = QTransform::type();
            if (2 < iVar28) {
              if ((((iVar28 != 4) || (*pdVar20 != 0.0)) || (NAN(*pdVar20))) ||
                 ((pdVar20[4] != 0.0 || (NAN(pdVar20[4]))))) goto LAB_0059ca6e;
              dVar3 = pdVar20[1];
              dVar4 = pdVar20[3];
              if (((dVar3 != 1.0) || ((NAN(dVar3) || (dVar4 != -1.0)))) || (NAN(dVar4))) {
                if ((dVar3 != 1.0 || dVar4 != 1.0) &&
                   (dVar4 != 1.0 && dVar4 != -1.0 || dVar3 != -1.0)) goto LAB_0059ca6e;
              }
            }
            iVar37 = local_1d8._0_4_ + -1;
            iVar36 = local_1d8._4_4_ + -1;
            if (RStack_1cc.m_i == iVar36 && local_1d8._8_4_ == iVar37) {
              bVar8 = false;
              iVar28 = iVar37;
              RVar26.m_i = iVar36;
              goto LAB_0059cad0;
            }
            bVar11 = true;
            bVar8 = false;
            iVar28 = local_1d8._8_4_;
            RVar26.m_i = RStack_1cc.m_i;
            if ((pDVar17->cacheIndent).yp.m_i == 0 && (pDVar17->cacheIndent).xp.m_i == 0)
            goto LAB_0059cad0;
          }
          else {
LAB_0059ca6e:
            lhs->allExposed = true;
            QList<QRectF>::clear(&lhs->exposed);
            (pDVar17->cacheIndent).xp = 0;
            (pDVar17->cacheIndent).yp = 0;
            QPixmap::QPixmap((QPixmap *)&local_e8);
            QPixmap::operator=((QPixmap *)&local_198,(QPixmap *)&local_e8);
            QPixmap::~QPixmap((QPixmap *)&local_e8);
            iVar37 = local_1d8._0_4_ + -1;
            iVar36 = local_1d8._4_4_ + -1;
            bVar8 = true;
            iVar28 = local_1d8._8_4_;
            RVar26.m_i = RStack_1cc.m_i;
LAB_0059cad0:
            if ((iVar28 == iVar37) && (RVar26.m_i == iVar36)) {
              bVar11 = false;
            }
            else {
              bVar11 = false;
              cVar10 = QRect::contains((QRect *)local_1d8,SUB81(&pixmapExposed,0));
              if (cVar10 == '\0') {
                bVar11 = true;
                if ((double)((RStack_1c0.m_i - (int)pixmapExposed.d) + 1) <=
                    (double)((local_1d8._8_4_ - local_1d8._0_4_) + 1) * 1.2) {
                  bVar11 = (double)((RStack_1cc.m_i - local_1d8._4_4_) + 1) * 1.2 <
                           (double)((RStack_1bc.m_i - pixmapExposed.d._4_4_) + 1);
                }
              }
            }
          }
          scrollExposure.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
          QRegion::QRegion(&scrollExposure);
          if (bVar11) {
            RVar30.m_i = local_1d8._0_4_ - (int)pixmapExposed.d;
            if (RVar30.m_i == 0 || (int)local_1d8._0_4_ < (int)pixmapExposed.d) {
              RVar30.m_i = 0;
            }
            RVar38.m_i = local_1d8._4_4_ - pixmapExposed.d._4_4_;
            if (RVar38.m_i == 0 || (int)local_1d8._4_4_ < pixmapExposed.d._4_4_) {
              RVar38.m_i = 0;
            }
            QRect::operator&=((QRect *)&pixmapExposed,(QRect *)local_1d8);
            cVar10 = QPixmap::isNull();
            if (cVar10 != '\0') {
              (pDVar17->cacheIndent).xp = 0;
              (pDVar17->cacheIndent).yp = 0;
              lhs->allExposed = true;
              QList<QRectF>::clear(&lhs->exposed);
              bVar8 = true;
            }
            iVar28 = (pDVar17->cacheIndent).xp.m_i;
            iVar36 = (pDVar17->cacheIndent).yp.m_i;
            if ((RVar30.m_i == iVar28) && (RVar38.m_i == iVar36)) {
              iVar36 = RStack_1c0.m_i - (int)pixmapExposed.d;
              iVar28 = RStack_1bc.m_i - pixmapExposed.d._4_4_;
              local_e8.m_matrix[0][0] = (qreal)QPixmap::size();
              QVar21 = operator/((QSize *)&local_e8,c);
              if ((iVar36 + 1 != QVar21.wd.m_i.m_i) || (iVar28 + 1 != QVar21.ht.m_i.m_i)) {
                iVar28 = (pDVar17->cacheIndent).xp.m_i;
                iVar36 = (pDVar17->cacheIndent).yp.m_i;
                goto LAB_0059cc73;
              }
            }
            else {
LAB_0059cc73:
              local_e8.m_matrix[0][2] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
              local_e8.m_matrix[0][0] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
              local_e8.m_matrix[0][1] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
              exposed.d = (QRegionData *)
                          CONCAT44((RStack_1bc.m_i - pixmapExposed.d._4_4_) + 1,
                                   (RStack_1c0.m_i - (int)pixmapExposed.d) + 1);
              _newPixPainter = operator*((QSize *)&exposed,c);
              QPixmap::QPixmap((QPixmap *)&local_e8,(QSize *)&newPixPainter);
              QColor::QColor((QColor *)&newPixPainter,transparent);
              QPixmap::fill((QColor *)&local_e8);
              cVar10 = QPixmap::isNull();
              if (cVar10 == '\0') {
                QPixmap::setDevicePixelRatio(c);
                _newPixPainter = (QSize)&DAT_aaaaaaaaaaaaaaaa;
                QPainter::QPainter(&newPixPainter,(QPaintDevice *)&local_e8);
                exposed.d = (QRegionData *)CONCAT44(-(RVar38.m_i - iVar36),-(RVar30.m_i - iVar28));
                QPainter::drawPixmap(&newPixPainter,(QPoint *)&exposed,(QPixmap *)&local_198);
                QPainter::end();
                QPainter::~QPainter(&newPixPainter);
              }
              exposed.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
              QRegion::QRegion(&exposed);
              local_238 = (undefined1  [8])QPixmap::size();
              operator/((QSize *)local_238,c);
              _newPixPainter = 0;
              RStack_134.m_i = 0;
              QRegion::operator+=(&exposed,(QRect *)&newPixPainter);
              cVar10 = QPixmap::isNull();
              if (cVar10 == '\0') {
                pixmapExposed_1.d = (QRegionData *)QPixmap::size();
                operator/((QSize *)&pixmapExposed_1,c);
                RStack_134.m_i = -(RVar38.m_i - iVar36);
                _newPixPainter = -(RVar30.m_i - iVar28);
                QRegion::QRegion((QRegion *)local_238,(QRect *)&newPixPainter,Rectangle);
                QRegion::operator-=(&exposed,(QRegion *)local_238);
                QRegion::~QRegion((QRegion *)local_238);
              }
              QRegion::operator=(&scrollExposure,&exposed);
              QPixmap::operator=((QPixmap *)&local_198,(QPixmap *)&local_e8);
              QRegion::~QRegion(&exposed);
              QPixmap::~QPixmap((QPixmap *)&local_e8);
              bVar8 = true;
            }
            QVar22.yp.m_i = RVar38.m_i;
            QVar22.xp.m_i = RVar30.m_i;
            pDVar17->cacheIndent = QVar22;
          }
          else {
            (pDVar17->cacheIndent).xp = 0;
            (pDVar17->cacheIndent).yp = 0;
            iVar36 = RStack_1c0.m_i - (int)pixmapExposed.d;
            iVar28 = RStack_1bc.m_i - pixmapExposed.d._4_4_;
            local_e8.m_matrix[0][0] = (qreal)QPixmap::size();
            QVar21 = operator/((QSize *)&local_e8,c);
            if ((iVar36 + 1 != QVar21.wd.m_i.m_i) || (iVar28 + 1 != QVar21.ht.m_i.m_i)) {
              exposed.d = (QRegionData *)
                          CONCAT44((RStack_1bc.m_i - pixmapExposed.d._4_4_) + 1,
                                   (RStack_1c0.m_i - (int)pixmapExposed.d) + 1);
              _newPixPainter = operator*((QSize *)&exposed,c);
              QPixmap::QPixmap((QPixmap *)&local_e8,(QSize *)&newPixPainter);
              QPixmap::operator=((QPixmap *)&local_198,(QPixmap *)&local_e8);
              QPixmap::~QPixmap((QPixmap *)&local_e8);
              lhs->allExposed = true;
              QList<QRectF>::clear(&lhs->exposed);
              bVar8 = true;
            }
          }
          if (((lhs->allExposed == false) && ((lhs->exposed).d.size == 0)) &&
             (cVar10 = QRegion::isEmpty(), cVar10 != '\0')) {
            if (bVar8) goto LAB_0059d310;
          }
          else {
            if (cVar9 != '\0') {
              QPixmapCache::remove(&pixmapKey);
            }
            QVar6.d = pixmapExposed.d;
            pqVar24 = (qreal *)QPainter::worldTransform();
            pQVar18 = &local_e8;
            for (lVar25 = 10; lVar25 != 0; lVar25 = lVar25 + -1) {
              pQVar18->m_matrix[0][0] = *pqVar24;
              pqVar24 = pqVar24 + (ulong)bVar39 * -2 + 1;
              pQVar18 = (QTransform *)((long)pQVar18 + ((ulong)bVar39 * -2 + 1) * 8);
            }
            if ((ulong)QVar6.d >> 0x20 != 0 || (int)QVar6.d != 0) {
              QTransform::fromTranslate
                        (-(double)(int)QVar6.d,-(double)(int)((ulong)QVar6.d >> 0x20));
              QTransform::operator*=(&local_e8,(QTransform *)&newPixPainter);
            }
            pixmapExposed_1.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
            QRegion::QRegion(&pixmapExposed_1,&scrollExposure);
            bVar12 = lhs->allExposed;
            if ((bool)bVar12 == false) {
              for (lVar25 = (lhs->exposed).d.size << 5; lVar25 != 0; lVar25 = lVar25 + -0x20) {
                QTransform::mapRect((QRectF *)&newPixPainter);
                QVar46 = QRectF::toRect((QRectF *)&newPixPainter);
                exposed.d = (QRegionData *)
                            (CONCAT44(QVar46.y1.m_i.m_i,(int)(QVar46._0_8_ + 0xffffffff)) +
                            -0x100000000);
                QRegion::operator+=(&pixmapExposed_1,(QRect *)&exposed);
              }
              bVar12 = lhs->allExposed;
            }
            exposed.d = (QRegionData *)0x0;
            if ((bVar12 & 1) == 0) {
              pQVar29 = (lhs->exposed).d.ptr;
              for (lVar25 = (lhs->exposed).d.size << 5; lVar25 != 0; lVar25 = lVar25 + -0x20) {
                QRectF::operator|=((QRectF *)&exposed,pQVar29);
                pQVar29 = pQVar29 + 1;
              }
              puVar31 = &DAT_006795c0;
              pQVar33 = (QRect *)&newPixPainter;
              for (lVar25 = 10; lVar25 != 0; lVar25 = lVar25 + -1) {
                uVar16 = *puVar31;
                pQVar33->x1 = (Representation)(int)uVar16;
                pQVar33->y1 = (Representation)(int)((ulong)uVar16 >> 0x20);
                puVar31 = puVar31 + (ulong)bVar39 * -2 + 1;
                pQVar33 = (QRect *)&pQVar33[-(ulong)bVar39].x2;
              }
              QTransform::inverted((bool *)&newPixPainter);
              lVar25 = QRegion::begin();
              lVar23 = QRegion::end();
              for (; lVar25 != lVar23; lVar25 = lVar25 + 0x10) {
                auVar45 = QTransform::mapRect((QRect *)&newPixPainter);
                local_238 = (undefined1  [8])(double)auVar45._0_4_;
                local_230 = (double)auVar45._4_4_;
                local_228 = (double)(((long)auVar45._8_4_ - (long)auVar45._0_4_) + 1);
                local_220 = (double)(((auVar45._8_8_ >> 0x20) - (auVar45._0_8_ >> 0x20)) + 1);
                QRectF::operator|=((QRectF *)&exposed,(QRectF *)local_238);
              }
            }
            else {
              (*item->_vptr_QGraphicsItem[3])(&exposed,item);
            }
            QStyleOptionGraphicsItem::operator=(&this->styleOptionTmp,option);
            (this->styleOptionTmp).exposedRect.xp = (double)exposed.d + -1.0;
            (this->styleOptionTmp).exposedRect.yp = -1.0;
            (this->styleOptionTmp).exposedRect.w = 2.0;
            (this->styleOptionTmp).exposedRect.h = 2.0;
            QPixmap::setDevicePixelRatio(c);
            RVar13.super_QFlagsStorageHelper<QPainter::RenderHint,_4>.
            super_QFlagsStorage<QPainter::RenderHint>.i =
                 (QFlagsStorageHelper<QPainter::RenderHint,_4>)QPainter::renderHints();
            _q_paintIntoCache((QPixmap *)&local_198,item,&pixmapExposed_1,&local_e8,RVar13,
                              &this->styleOptionTmp,painterStateProtection);
            lhs->allExposed = false;
            QList<QRectF>::clear(&lhs->exposed);
            QRegion::~QRegion(&pixmapExposed_1);
LAB_0059d310:
            QPixmapCache::insert((QPixmap *)&local_e8);
            QVar21 = (QSize)(pDVar17->key).d;
            (pDVar17->key).d = (KeyData *)local_e8.m_matrix[0][0];
            local_e8.m_matrix[0][0] = (qreal)QVar21;
            QPixmapCache::Key::~Key((Key *)&local_e8);
          }
          pqVar24 = (qreal *)QPainter::worldTransform();
          pQVar18 = &local_e8;
          for (lVar25 = 10; lVar25 != 0; lVar25 = lVar25 + -1) {
            pQVar18->m_matrix[0][0] = *pqVar24;
            pqVar24 = pqVar24 + (ulong)bVar39 * -2 + 1;
            pQVar18 = (QTransform *)((long)pQVar18 + ((ulong)bVar39 * -2 + 1) * 8);
          }
          puVar31 = &DAT_00679578;
          pQVar34 = &newPixPainter;
          for (lVar25 = 9; lVar25 != 0; lVar25 = lVar25 + -1) {
            *(undefined8 *)pQVar34 = *puVar31;
            puVar31 = puVar31 + (ulong)bVar39 * -2 + 1;
            pQVar34 = pQVar34 + (ulong)bVar39 * -0x10 + 8;
          }
          QPainter::setWorldTransform((QTransform *)painter,SUB81(&newPixPainter,0));
          if ((dVar42 != dVar40) || (NAN(dVar42) || NAN(dVar40))) {
            QPainter::setOpacity(dVar42);
            _newPixPainter = (QSize)pixmapExposed.d;
            QPainter::drawPixmap(painter,(QPoint *)&newPixPainter,(QPixmap *)&local_198);
            QPainter::setOpacity(dVar40);
          }
          else {
            _newPixPainter = (QSize)pixmapExposed.d;
            QPainter::drawPixmap(painter,(QPoint *)&newPixPainter,(QPixmap *)&local_198);
          }
          QPainter::setWorldTransform((QTransform *)painter,SUB81(&local_e8,0));
          QRegion::~QRegion(&scrollExposure);
        }
        else {
          _q_paintItem(item,painter,option,widget,(bool)(-(dVar40 != dVar42) & 1),
                       painterStateProtection);
        }
      }
    }
LAB_0059d415:
    QPixmap::~QPixmap((QPixmap *)&local_198);
    QPixmapCache::Key::~Key(&pixmapKey);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0059d454:
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::drawItemHelper(QGraphicsItem *item, QPainter *painter,
                                           const QStyleOptionGraphicsItem *option, QWidget *widget,
                                           bool painterStateProtection)
{
    QGraphicsItemPrivate *itemd = item->d_ptr.data();
    QGraphicsItem::CacheMode cacheMode = QGraphicsItem::CacheMode(itemd->cacheMode);

    // Render directly, using no cache.
    if (cacheMode == QGraphicsItem::NoCache) {
        _q_paintItem(static_cast<QGraphicsWidget *>(item), painter, option, widget, true, painterStateProtection);
        return;
    }

    const qreal devicePixelRatio = painter->device()->devicePixelRatio();
    const qreal oldPainterOpacity = painter->opacity();
    qreal newPainterOpacity = oldPainterOpacity;
    QGraphicsProxyWidget *proxy = item->isWidget() ? qobject_cast<QGraphicsProxyWidget *>(static_cast<QGraphicsWidget *>(item)) : 0;
    if (proxy && proxy->widget()) {
        const qreal windowOpacity = proxy->widget()->windowOpacity();
        if (windowOpacity < 1.0)
            newPainterOpacity *= windowOpacity;
    }

    // Item's (local) bounding rect
    QRectF brect = item->boundingRect();
    QRectF adjustedBrect(brect);
    _q_adjustRect(&adjustedBrect);
    if (adjustedBrect.isEmpty())
        return;

    // Fetch the off-screen transparent buffer and exposed area info.
    QPixmapCache::Key pixmapKey;
    QPixmap pix;

    bool pixmapFound;
    QGraphicsItemCache *itemCache = itemd->extraItemCache();
    if (cacheMode == QGraphicsItem::ItemCoordinateCache) {
        pixmapKey = itemCache->key;
    } else {
        pixmapKey = itemCache->deviceData.value(widget).key;
    }

    // Find pixmap in cache.
    pixmapFound = QPixmapCache::find(pixmapKey, &pix);

    // Render using item coordinate cache mode.
    if (cacheMode == QGraphicsItem::ItemCoordinateCache) {
        QSize pixmapSize;
        bool fixedCacheSize = itemCache->fixedSize.isValid();
        QRect br = brect.toAlignedRect();
        if (fixedCacheSize) {
            pixmapSize = itemCache->fixedSize;
        } else {
            pixmapSize = br.size();
        }

        pixmapSize *= devicePixelRatio;

        // Create or recreate the pixmap.
        int adjust = itemCache->fixedSize.isValid() ? 0 : 2;
        QSize adjustSize(adjust*2, adjust*2);
        br.adjust(-adjust / devicePixelRatio, -adjust / devicePixelRatio, adjust / devicePixelRatio, adjust / devicePixelRatio);
        if (pix.isNull() || (!fixedCacheSize && (pixmapSize + adjustSize) != pix.size())) {
            pix = QPixmap(pixmapSize + adjustSize);
            itemCache->boundingRect = br;
            itemCache->exposed.clear();
            itemCache->allExposed = true;
        } else if (itemCache->boundingRect != br) {
            itemCache->boundingRect = br;
            itemCache->exposed.clear();
            itemCache->allExposed = true;
        }

        // Redraw any newly exposed areas.
        if (itemCache->allExposed || !itemCache->exposed.isEmpty()) {

            //We know that we will modify the pixmap, removing it from the cache
            //will detach the one we have and avoid a deep copy
            if (pixmapFound)
                QPixmapCache::remove(pixmapKey);

            // Fit the item's bounding rect into the pixmap's coordinates.
            QTransform itemToPixmap;
            if (fixedCacheSize) {
                const QPointF scale((pixmapSize.width() / devicePixelRatio) / brect.width(),
                                    (pixmapSize.height() / devicePixelRatio) / brect.height());
                itemToPixmap.scale(scale.x(), scale.y());
            }
            itemToPixmap.translate(-br.x(), -br.y());

            // Generate the item's exposedRect and map its list of expose
            // rects to device coordinates.
            styleOptionTmp = *option;
            QRegion pixmapExposed;
            QRectF exposedRect;
            if (!itemCache->allExposed) {
                for (const auto &rect : std::as_const(itemCache->exposed)) {
                    exposedRect |= rect;
                    pixmapExposed += itemToPixmap.mapRect(rect).toAlignedRect();
                }
            } else {
                exposedRect = brect;
            }
            styleOptionTmp.exposedRect = exposedRect;

            // Render.
            pix.setDevicePixelRatio(devicePixelRatio);
            _q_paintIntoCache(&pix, item, pixmapExposed, itemToPixmap, painter->renderHints(),
                              &styleOptionTmp, painterStateProtection);

            // insert this pixmap into the cache.
            itemCache->key = QPixmapCache::insert(pix);

            // Reset expose data.
            itemCache->allExposed = false;
            itemCache->exposed.clear();
        }

        // Redraw the exposed area using the transformed painter. Depending on
        // the hardware, this may be a server-side operation, or an expensive
        // qpixmap-image-transform-pixmap roundtrip.
        if (newPainterOpacity != oldPainterOpacity) {
            painter->setOpacity(newPainterOpacity);
            painter->drawPixmap(br.topLeft(), pix);
            painter->setOpacity(oldPainterOpacity);
        } else {
            painter->drawPixmap(br.topLeft(), pix);
        }
        return;
    }

    // Render using device coordinate cache mode.
    if (cacheMode == QGraphicsItem::DeviceCoordinateCache) {
        // Find the item's bounds in device coordinates.
        QRectF deviceBounds = painter->worldTransform().mapRect(brect);
        QRect deviceRect = deviceBounds.toRect().adjusted(-1, -1, 1, 1);
        if (deviceRect.isEmpty())
            return;
        QRect viewRect = widget ? widget->rect() : QRect();
        if (widget && !viewRect.intersects(deviceRect))
            return;

        // Resort to direct rendering if the device rect exceeds the
        // (optional) maximum bounds. (QGraphicsSvgItem uses this).
        QSize maximumCacheSize =
            itemd->extra(QGraphicsItemPrivate::ExtraMaxDeviceCoordCacheSize).toSize();
        if (!maximumCacheSize.isEmpty()
            && (deviceRect.width() > maximumCacheSize.width()
                || deviceRect.height() > maximumCacheSize.height())) {
            _q_paintItem(static_cast<QGraphicsWidget *>(item), painter, option, widget,
                         oldPainterOpacity != newPainterOpacity, painterStateProtection);
            return;
        }

        // Create or reuse offscreen pixmap, possibly scroll/blit from the old one.
        // If the world transform is rotated we always recreate the cache to avoid
        // wrong blending.
        bool pixModified = false;
        QGraphicsItemCache::DeviceData *deviceData = &itemCache->deviceData[widget];
        bool invertable = true;
        QTransform diff = deviceData->lastTransform.inverted(&invertable);
        if (invertable)
            diff *= painter->worldTransform();
        deviceData->lastTransform = painter->worldTransform();
        bool allowPartialCacheExposure = false;
        bool simpleTransform = invertable && diff.type() <= QTransform::TxTranslate
                               && transformIsSimple(painter->worldTransform());
        if (!simpleTransform) {
            pixModified = true;
            itemCache->allExposed = true;
            itemCache->exposed.clear();
            deviceData->cacheIndent = QPoint();
            pix = QPixmap();
        } else if (!viewRect.isNull()) {
            allowPartialCacheExposure = deviceData->cacheIndent != QPoint();
        }

        // Allow partial cache exposure if the device rect isn't fully contained and
        // deviceRect is 20% taller or wider than the viewRect.
        if (!allowPartialCacheExposure && !viewRect.isNull() && !viewRect.contains(deviceRect)) {
            allowPartialCacheExposure = (viewRect.width() * 1.2 < deviceRect.width())
                                         || (viewRect.height() * 1.2 < deviceRect.height());
        }

        QRegion scrollExposure;
        if (allowPartialCacheExposure) {
            // Part of pixmap is drawn. Either device contains viewrect (big
            // item covers whole screen) or parts of device are outside the
            // viewport. In either case the device rect must be the intersect
            // between the two.
            int dx = deviceRect.left() < viewRect.left() ? viewRect.left() - deviceRect.left() : 0;
            int dy = deviceRect.top() < viewRect.top() ? viewRect.top() - deviceRect.top() : 0;
            QPoint newCacheIndent(dx, dy);
            deviceRect &= viewRect;

            if (pix.isNull()) {
                deviceData->cacheIndent = QPoint();
                itemCache->allExposed = true;
                itemCache->exposed.clear();
                pixModified = true;
            }

            // Copy / "scroll" the old pixmap onto the new ole and calculate
            // scrolled exposure.
            if (newCacheIndent != deviceData->cacheIndent || deviceRect.size() != pix.size() / devicePixelRatio) {
                QPoint diff = newCacheIndent - deviceData->cacheIndent;
                QPixmap newPix(deviceRect.size() * devicePixelRatio);
                // ### Investigate removing this fill (test with Plasma and
                // graphicssystem raster).
                newPix.fill(Qt::transparent);
                if (!pix.isNull()) {
                    newPix.setDevicePixelRatio(devicePixelRatio);
                    QPainter newPixPainter(&newPix);
                    newPixPainter.drawPixmap(-diff, pix);
                    newPixPainter.end();
                }
                QRegion exposed;
                exposed += QRect(QPoint(0,0), newPix.size() / devicePixelRatio);
                if (!pix.isNull())
                    exposed -= QRect(-diff, pix.size() / devicePixelRatio);
                scrollExposure = exposed;

                pix = newPix;
                pixModified = true;
            }
            deviceData->cacheIndent = newCacheIndent;
        } else {
            // Full pixmap is drawn.
            deviceData->cacheIndent = QPoint();

            // Auto-adjust the pixmap size.
            if (deviceRect.size() != pix.size() / devicePixelRatio) {
                // exposed needs to cover the whole pixmap
                pix = QPixmap(deviceRect.size() * devicePixelRatio);
                pixModified = true;
                itemCache->allExposed = true;
                itemCache->exposed.clear();
            }
        }

        // Check for newly invalidated areas.
        if (itemCache->allExposed || !itemCache->exposed.isEmpty() || !scrollExposure.isEmpty()) {
            //We know that we will modify the pixmap, removing it from the cache
            //will detach the one we have and avoid a deep copy
            if (pixmapFound)
                QPixmapCache::remove(pixmapKey);

            // Construct an item-to-pixmap transform.
            QPointF p = deviceRect.topLeft();
            QTransform itemToPixmap = painter->worldTransform();
            if (!p.isNull())
                itemToPixmap *= QTransform::fromTranslate(-p.x(), -p.y());

            // Map the item's logical expose to pixmap coordinates.
            QRegion pixmapExposed = scrollExposure;
            if (!itemCache->allExposed) {
                for (const auto &rect : std::as_const(itemCache->exposed))
                    pixmapExposed += itemToPixmap.mapRect(rect).toRect().adjusted(-1, -1, 1, 1);
            }

            // Calculate the style option's exposedRect.
            QRectF br;
            if (itemCache->allExposed) {
                br = item->boundingRect();
            } else {
                for (const auto &rect : std::as_const(itemCache->exposed))
                    br |= rect;
                QTransform pixmapToItem = itemToPixmap.inverted();
                for (const QRect &r : std::as_const(scrollExposure))
                    br |= pixmapToItem.mapRect(r);
            }
            styleOptionTmp = *option;
            styleOptionTmp.exposedRect = br.adjusted(-1, -1, 1, 1);

            // Render the exposed areas.
            pix.setDevicePixelRatio(devicePixelRatio);
            _q_paintIntoCache(&pix, item, pixmapExposed, itemToPixmap, painter->renderHints(),
                              &styleOptionTmp, painterStateProtection);

            // Reset expose data.
            pixModified = true;
            itemCache->allExposed = false;
            itemCache->exposed.clear();
        }

        if (pixModified) {
            // Insert this pixmap into the cache.
            deviceData->key = QPixmapCache::insert(pix);
        }

        // Redraw the exposed area using an untransformed painter. This
        // effectively becomes a bitblit that does not transform the cache.
        QTransform restoreTransform = painter->worldTransform();
        painter->setWorldTransform(QTransform());
        if (newPainterOpacity != oldPainterOpacity) {
            painter->setOpacity(newPainterOpacity);
            painter->drawPixmap(deviceRect.topLeft(), pix);
            painter->setOpacity(oldPainterOpacity);
        } else {
            painter->drawPixmap(deviceRect.topLeft(), pix);
        }
        painter->setWorldTransform(restoreTransform);
        return;
    }
}